

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_util.cc
# Opt level: O0

void raptor_sockaddr_make_wildcard4(int port,raptor_resolved_address *resolved_wild_out)

{
  uint16_t uVar1;
  bool local_21;
  raptor_sockaddr_in *wild_out;
  raptor_resolved_address *resolved_wild_out_local;
  int port_local;
  
  local_21 = (uint)port < 0x10000;
  if (local_21) {
    memset(resolved_wild_out,0,0x84);
    resolved_wild_out->addr[0] = '\x02';
    resolved_wild_out->addr[1] = '\0';
    uVar1 = htons((uint16_t)port);
    *(uint16_t *)(resolved_wild_out->addr + 2) = uVar1;
    resolved_wild_out->len = 0x10;
    return;
  }
  raptor::LogFormatPrint
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/core/socket_util.cc"
             ,0x8c,kLogLevelError,"assertion failed: %s","port >= 0 && port < 65536");
  abort();
}

Assistant:

void raptor_sockaddr_make_wildcard4(int port,
                                    raptor_resolved_address* resolved_wild_out) {
    raptor_sockaddr_in* wild_out =
        reinterpret_cast<raptor_sockaddr_in*>(resolved_wild_out->addr);
    RAPTOR_ASSERT(port >= 0 && port < 65536);
    memset(resolved_wild_out, 0, sizeof(*resolved_wild_out));
    wild_out->sin_family = AF_INET;
    wild_out->sin_port = htons(static_cast<uint16_t>(port));
    resolved_wild_out->len = static_cast<socklen_t>(sizeof(raptor_sockaddr_in));
}